

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O2

void __thiscall PathTracerThread::path_tracer_thread_func(PathTracerThread *this)

{
  uint uVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  void *__stat_loc;
  shared_ptr<myvk::CommandBuffer> pt_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> pt_command_pool;
  
  spdlog::info<char[25]>((char (*) [25])"Enter path tracer thread");
  myvk::Queue::WaitIdle
            ((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  iVar3 = (*(((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar2 = (this->m_path_tracer_viewer_ptr).
           super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  myvk::CommandPool::Create((CommandPool *)&pt_command_pool,&this->m_path_tracer_queue,0);
  myvk::Fence::Create((Fence *)&fence,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),0);
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&pt_command_buffer,&pt_command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin
            (pt_command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,0);
  PathTracer::CmdRender
            ((peVar2->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&pt_command_buffer);
  myvk::CommandBuffer::End
            (pt_command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  acquire_resources(this);
  while (((this->m_run)._M_base._M_i & 1U) != 0) {
    myvk::Fence::Reset(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    myvk::CommandBuffer::Submit
              (pt_command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&fence);
    __stat_loc = (void *)0xffffffffffffffff;
    myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      0xffffffffffffffff);
    uVar1 = this->m_spp;
    this->m_spp = uVar1 + 1;
    if (uVar1 % 10 == 0) {
      UpdateViewer(this);
    }
    while (((this->m_pause)._M_base._M_i & 1U) != 0) {
      spdlog::debug<char[23]>((char (*) [23])"m_pause_semaphore wait");
      binary_semaphore::wait(&this->m_pause_semaphore,__stat_loc);
    }
  }
  release_resources(this);
  spdlog::info<char[24]>((char (*) [24])"Quit path tracer thread");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pt_command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pt_command_pool.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void PathTracerThread::path_tracer_thread_func() {
	spdlog::info("Enter path tracer thread");

	m_main_queue->WaitIdle();

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> pt_command_pool = myvk::CommandPool::Create(m_path_tracer_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);

	std::shared_ptr<myvk::CommandBuffer> pt_command_buffer = myvk::CommandBuffer::Create(pt_command_pool);
	pt_command_buffer->Begin();
	path_tracer->CmdRender(pt_command_buffer);
	pt_command_buffer->End();

	acquire_resources();

	while (m_run.load(std::memory_order_acquire)) {
		fence->Reset();
		pt_command_buffer->Submit(fence);
		fence->Wait();

		if ((m_spp++) % kPTResultUpdateInterval == 0)
			UpdateViewer();

		while (m_pause.load(std::memory_order_acquire)) {
			spdlog::debug("m_pause_semaphore wait");
			m_pause_semaphore.wait();
		}
	}

	release_resources();

	spdlog::info("Quit path tracer thread");
}